

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# _PDCLIB_tzparse.c
# Opt level: O2

char * getnum(char *strp,int *nump,int min,int max)

{
  byte bVar1;
  int iVar2;
  
  if ((strp != (char *)0x0) && (bVar1 = *strp, bVar1 - 0x30 < 10)) {
    iVar2 = 0;
    do {
      iVar2 = iVar2 * 10 + (int)(char)bVar1 + -0x30;
      if (max < iVar2) {
        return (char *)0x0;
      }
      bVar1 = strp[1];
      strp = strp + 1;
    } while (bVar1 - 0x30 < 10);
    if (min <= iVar2) {
      *nump = iVar2;
      return strp;
    }
  }
  return (char *)0x0;
}

Assistant:

static const char * getnum( const char * strp, int * nump, int min, int max )
{
    char c;
    int  num;

    if ( strp == NULL || ! isdigit( (unsigned char)( c = *strp ) ) )
    {
        return NULL;
    }

    num = 0;

    do
    {
        num = num * 10 + ( c - '0' );

        if ( num > max )
        {
            return NULL;    /* illegal value */
        }

        c = *++strp;
    } while ( isdigit( (unsigned char)c ) );

    if ( num < min )
    {
        return NULL;        /* illegal value */
    }

    *nump = num;
    return strp;
}